

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo.cpp
# Opt level: O1

void __thiscall QHostInfo::QHostInfo(QHostInfo *this,int id)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  qsizetype qVar5;
  QHostInfoPrivate *pQVar6;
  QHostInfoPrivate *d;
  long in_FS_OFFSET;
  QByteArrayView QVar7;
  undefined8 local_48;
  undefined8 uStack_40;
  qsizetype local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = (QHostInfoPrivate *)operator_new(0x58);
  pQVar6->err = NoError;
  QVar7.m_data = (storage_type *)0xd;
  QVar7.m_size = (qsizetype)&local_48;
  QString::fromLatin1(QVar7);
  qVar5 = local_38;
  uVar1 = (undefined4)local_48;
  uVar2 = local_48._4_4_;
  uVar3 = (undefined4)uStack_40;
  uVar4 = uStack_40._4_4_;
  local_48 = 0;
  uStack_40 = 0;
  *(undefined4 *)&(pQVar6->errorStr).d.d = uVar1;
  *(undefined4 *)((long)&(pQVar6->errorStr).d.d + 4) = uVar2;
  *(undefined4 *)&(pQVar6->errorStr).d.ptr = uVar3;
  *(undefined4 *)((long)&(pQVar6->errorStr).d.ptr + 4) = uVar4;
  local_38 = 0;
  (pQVar6->errorStr).d.size = qVar5;
  pQVar6->lookupId = 0;
  (pQVar6->hostName).d.ptr = (char16_t *)0x0;
  (pQVar6->hostName).d.size = 0;
  (pQVar6->addrs).d.size = 0;
  (pQVar6->hostName).d.d = (Data *)0x0;
  (pQVar6->addrs).d.d = (Data *)0x0;
  (pQVar6->addrs).d.ptr = (QHostAddress *)0x0;
  this->d_ptr = pQVar6;
  pQVar6->lookupId = id;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QHostInfo::QHostInfo(int id)
    : d_ptr(new QHostInfoPrivate)
{
    Q_D(QHostInfo);
    d->lookupId = id;
}